

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_fwd_txfm2d_avx2.c
# Opt level: O2

void fdct8x16_new_avx2(__m128i *input,__m128i *output,int8_t cos_bit)

{
  uint uVar1;
  int iVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  int iVar5;
  int iVar6;
  undefined7 in_register_00000011;
  long lVar7;
  uint uVar8;
  uint uVar9;
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined4 uVar21;
  undefined4 uVar22;
  __m128i temp1;
  __m128i temp3;
  __m128i temp2;
  __m128i temp0;
  __m256i __rounding_256;
  __m256i in0;
  __m256i cospi_arr [12];
  __m256i in1;
  __m256i x1 [8];
  int8_t local_631;
  __m256i *local_630;
  __m256i *local_628;
  __m256i local_620;
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  __m128i local_590;
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  longlong local_4b0;
  longlong lStack_4a8;
  longlong local_4a0;
  longlong lStack_498;
  __m128i local_490;
  int local_480;
  int iStack_47c;
  int iStack_478;
  int iStack_474;
  int iStack_470;
  int iStack_46c;
  int iStack_468;
  int iStack_464;
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  __m256i local_420;
  uint local_400;
  uint uStack_3fc;
  uint uStack_3f8;
  uint uStack_3f4;
  uint uStack_3f0;
  uint uStack_3ec;
  uint uStack_3e8;
  uint uStack_3e4;
  __m256i local_3e0;
  __m256i local_3c0;
  __m256i local_3a0;
  undefined1 local_380 [16];
  int local_370;
  int iStack_36c;
  int iStack_368;
  int iStack_364;
  __m256i local_360;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint local_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  uint local_320;
  uint uStack_31c;
  uint uStack_318;
  uint uStack_314;
  uint local_310;
  uint uStack_30c;
  uint uStack_308;
  uint uStack_304;
  uint local_300;
  uint uStack_2fc;
  uint uStack_2f8;
  uint uStack_2f4;
  uint local_2f0;
  uint uStack_2ec;
  uint uStack_2e8;
  uint uStack_2e4;
  uint local_2e0;
  uint uStack_2dc;
  uint uStack_2d8;
  uint uStack_2d4;
  uint local_2d0;
  uint uStack_2cc;
  uint uStack_2c8;
  uint uStack_2c4;
  uint local_2c0;
  uint uStack_2bc;
  uint uStack_2b8;
  uint uStack_2b4;
  uint local_2b0;
  uint uStack_2ac;
  uint uStack_2a8;
  uint uStack_2a4;
  uint local_2a0;
  uint uStack_29c;
  uint uStack_298;
  uint uStack_294;
  uint local_290;
  uint uStack_28c;
  uint uStack_288;
  uint uStack_284;
  __m256i local_280;
  __m256i local_260;
  __m256i local_240 [7];
  undefined1 local_160 [32];
  undefined1 local_140 [32];
  undefined1 local_120 [32];
  undefined1 local_100 [32];
  undefined1 local_e0 [32];
  __m256i local_c0;
  __m256i local_a0;
  undefined1 local_80 [32];
  undefined1 auVar20 [32];
  
  local_480 = 1 << (cos_bit - 1U & 0x1f);
  lVar7 = (long)(int)CONCAT71(in_register_00000011,cos_bit);
  local_5c0._0_8_ = lVar7;
  lVar7 = lVar7 * 0x100;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x1e0);
  local_400 = -uVar1 & 0xffff | uVar1 * 0x10000;
  iVar6 = (uVar1 & 0xffff) * 0x10001;
  iVar5 = (uVar1 & 0xffff) + uVar1 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x220);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1a0);
  uVar8 = uVar1 & 0xffff | iVar2 * 0x10000;
  uVar9 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  local_370 = (-uVar1 & 0xffff) + iVar2 * -0x10000;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x240);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x180);
  local_340 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_320 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x1c0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x200);
  local_330 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_310 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x250);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x170);
  local_300 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_2e0 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x1d0);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1f0);
  local_2f0 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_2d0 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 0x210);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x1b0);
  local_2c0 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_2a0 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  uVar1 = *(uint *)((long)vert_filter_length_chroma + lVar7 + 400);
  iVar2 = *(int *)((long)vert_filter_length_chroma + lVar7 + 0x230);
  local_2b0 = iVar2 << 0x10 | uVar1 & 0xffff;
  local_290 = uVar1 << 0x10 | -iVar2 & 0xffffU;
  local_5e0._4_4_ = local_400;
  local_5e0._0_4_ = local_400;
  local_5e0._8_4_ = local_400;
  local_5e0._12_4_ = local_400;
  local_5e0._16_4_ = local_400;
  local_5e0._20_4_ = local_400;
  local_5e0._24_4_ = local_400;
  local_5e0._28_4_ = local_400;
  uVar22 = iVar6;
  uVar21 = iVar6;
  auVar18._0_8_ = CONCAT44(uVar22,uVar21);
  auVar18._8_4_ = iVar6;
  auVar18._12_4_ = iVar6;
  local_620[2]._0_4_ = iVar6;
  local_620[0] = auVar18._0_8_;
  local_620[1] = auVar18._8_8_;
  local_620[2]._4_4_ = iVar6;
  local_620[3]._0_4_ = iVar6;
  local_620[3]._4_4_ = iVar6;
  local_380._4_4_ = uVar9;
  local_380._0_4_ = uVar9;
  local_380._8_4_ = uVar9;
  local_380._12_4_ = uVar9;
  auVar19._4_4_ = uVar8;
  auVar19._0_4_ = uVar8;
  auVar19._8_4_ = uVar8;
  auVar19._12_4_ = uVar8;
  auVar20._16_4_ = uVar8;
  auVar20._0_16_ = auVar19;
  auVar20._20_4_ = uVar8;
  auVar20._24_4_ = uVar8;
  auVar20._28_4_ = uVar8;
  local_3c0._0_16_ = ZEXT116(0) * auVar19 + ZEXT116(1) * auVar18;
  local_3c0._16_16_ = ZEXT116(0) * local_620._16_16_ + ZEXT116(1) * auVar19;
  auVar17._4_4_ = iVar5;
  auVar17._0_4_ = iVar5;
  auVar17._8_4_ = iVar5;
  auVar17._12_4_ = iVar5;
  local_3a0._0_16_ = ZEXT116(0) * local_380 + ZEXT116(1) * auVar17;
  local_3a0._16_16_ = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * local_380;
  local_600._4_4_ = local_480;
  local_600._0_4_ = local_480;
  local_600._8_4_ = local_480;
  local_600._12_4_ = local_480;
  local_600._16_4_ = local_480;
  local_600._20_4_ = local_480;
  local_600._24_4_ = local_480;
  local_600._28_4_ = local_480;
  local_360._0_16_ = ZEXT116(0) * local_380 + ZEXT116(1) * auVar19;
  local_360._16_16_ = ZEXT116(0) * auVar20._16_16_ + ZEXT116(1) * local_380;
  auVar10._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xe] + ZEXT116(1) * (undefined1  [16])input[0xf];
  auVar10._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xe];
  auVar12._0_16_ =
       ZEXT116(0) * (undefined1  [16])input[0xc] + ZEXT116(1) * (undefined1  [16])input[0xd];
  auVar12._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[0xc];
  auVar14._0_16_ = ZEXT116(0) * (undefined1  [16])input[4] + ZEXT116(1) * (undefined1  [16])input[5]
  ;
  auVar14._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[4];
  auVar16._0_16_ = ZEXT116(0) * (undefined1  [16])input[6] + ZEXT116(1) * (undefined1  [16])input[7]
  ;
  auVar16._16_16_ =
       ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * (undefined1  [16])input[6];
  local_160 = vpaddsw_avx2(*(undefined1 (*) [32])input,auVar10);
  local_4e0 = vpsubsw_avx2(*(undefined1 (*) [32])input,auVar10);
  local_140 = vpaddsw_avx2(*(undefined1 (*) [32])(input + 2),auVar12);
  local_a0 = (__m256i)vpsubsw_avx2(*(undefined1 (*) [32])(input + 2),auVar12);
  local_120 = vpaddsw_avx2(auVar14,*(undefined1 (*) [32])(input + 10));
  local_c0 = (__m256i)vpsubsw_avx2(auVar14,*(undefined1 (*) [32])(input + 10));
  local_100 = vpaddsw_avx2(auVar16,*(undefined1 (*) [32])(input + 8));
  local_500 = vpsubsw_avx2(auVar16,*(undefined1 (*) [32])(input + 8));
  local_580 = vpaddsw_avx2(local_160,local_100);
  local_520 = vpsubsw_avx2(local_160,local_100);
  local_460 = vpaddsw_avx2(local_140,local_120);
  local_440 = vpsubsw_avx2(local_140,local_120);
  local_628 = (__m256i *)local_380;
  local_630 = &local_360;
  local_540._0_8_ = &local_340;
  local_560._0_8_ = &local_320;
  local_631 = cos_bit;
  iStack_47c = local_480;
  iStack_478 = local_480;
  iStack_474 = local_480;
  iStack_470 = local_480;
  iStack_46c = local_480;
  iStack_468 = local_480;
  iStack_464 = local_480;
  uStack_3fc = local_400;
  uStack_3f8 = local_400;
  uStack_3f4 = local_400;
  uStack_3f0 = local_400;
  uStack_3ec = local_400;
  uStack_3e8 = local_400;
  uStack_3e4 = local_400;
  local_3e0 = local_620;
  iStack_36c = local_370;
  iStack_368 = local_370;
  iStack_364 = local_370;
  uStack_33c = local_340;
  uStack_338 = local_340;
  uStack_334 = local_340;
  uStack_32c = local_330;
  uStack_328 = local_330;
  uStack_324 = local_330;
  uStack_31c = local_320;
  uStack_318 = local_320;
  uStack_314 = local_320;
  uStack_30c = local_310;
  uStack_308 = local_310;
  uStack_304 = local_310;
  uStack_2fc = local_300;
  uStack_2f8 = local_300;
  uStack_2f4 = local_300;
  uStack_2ec = local_2f0;
  uStack_2e8 = local_2f0;
  uStack_2e4 = local_2f0;
  uStack_2dc = local_2e0;
  uStack_2d8 = local_2e0;
  uStack_2d4 = local_2e0;
  uStack_2cc = local_2d0;
  uStack_2c8 = local_2d0;
  uStack_2c4 = local_2d0;
  uStack_2bc = local_2c0;
  uStack_2b8 = local_2c0;
  uStack_2b4 = local_2c0;
  uStack_2ac = local_2b0;
  uStack_2a8 = local_2b0;
  uStack_2a4 = local_2b0;
  uStack_29c = local_2a0;
  uStack_298 = local_2a0;
  uStack_294 = local_2a0;
  uStack_28c = local_290;
  uStack_288 = local_290;
  uStack_284 = local_290;
  local_e0 = local_500;
  local_80 = local_4e0;
  btf_16_avx2((__m256i *)&local_400,&local_3e0,&local_c0,&local_a0,&local_490,&local_590,
              (__m128i *)&local_4a0,(__m128i *)&local_4b0,(__m256i *)&local_480,&local_631);
  auVar4._8_8_ = lStack_498;
  auVar4._0_8_ = local_4a0;
  auVar13._0_16_ = ZEXT116(0) * (undefined1  [16])local_490 + ZEXT116(1) * auVar4;
  auVar13._16_16_ = ZEXT116(1) * (undefined1  [16])local_490;
  auVar3._8_8_ = lStack_4a8;
  auVar3._0_8_ = local_4b0;
  auVar15._0_16_ = ZEXT116(0) * (undefined1  [16])local_590 + ZEXT116(1) * auVar3;
  auVar15._16_16_ = ZEXT116(1) * (undefined1  [16])local_590;
  auVar11 = vpermq_avx2(local_460,0x4e);
  auVar10 = vpaddsw_avx2(local_580,auVar11);
  auVar11 = vpsubsw_avx2(local_580,auVar11);
  local_580 = vpblendd_avx2(local_520,local_440,0xf0);
  auVar17 = vpunpcklwd_avx(local_440._0_16_,local_520._16_16_);
  auVar19 = vpunpckhwd_avx(local_440._0_16_,local_520._16_16_);
  auVar3 = vpmaddwd_avx(auVar17,local_5e0._0_16_);
  auVar4 = vpmaddwd_avx(auVar19,local_5e0._0_16_);
  auVar17 = vpmaddwd_avx(local_620._0_16_,auVar17);
  auVar19 = vpmaddwd_avx(local_620._0_16_,auVar19);
  auVar18 = local_600._0_16_;
  auVar3 = vpaddd_avx(auVar18,auVar3);
  auVar4 = vpaddd_avx(auVar18,auVar4);
  auVar17 = vpaddd_avx(auVar18,auVar17);
  auVar19 = vpaddd_avx(auVar18,auVar19);
  auVar3 = vpsrad_avx(auVar3,ZEXT416((uint)local_5c0._0_4_));
  auVar4 = vpsrad_avx(auVar4,ZEXT416((uint)local_5c0._0_4_));
  auVar17 = vpsrad_avx(auVar17,ZEXT416((uint)local_5c0._0_4_));
  auVar19 = vpsrad_avx(auVar19,ZEXT416((uint)local_5c0._0_4_));
  local_490 = (__m128i)vpackssdw_avx(auVar3,auVar4);
  local_5c0._0_8_ = local_490[0];
  local_5c0._8_8_ = local_490[1];
  local_590 = (__m128i)vpackssdw_avx(auVar17,auVar19);
  local_5e0 = ZEXT1632((undefined1  [16])local_590);
  local_600 = vpaddsw_avx2(local_500,auVar13);
  local_500 = vpsubsw_avx2(local_500,auVar13);
  local_620 = (__m256i)vpaddsw_avx2(local_4e0,auVar15);
  local_4e0 = vpsubsw_avx2(local_4e0,auVar15);
  local_260 = (__m256i)vpblendd_avx2(auVar10,auVar11,0xf0);
  local_240[0] = (__m256i)vperm2i128_avx2(auVar10,auVar11,0x21);
  btf_16_avx2(&local_3c0,&local_3a0,&local_260,local_240,output,output + 8,output + 4,output + 0xc,
              (__m256i *)&local_480,&local_631);
  auVar11._0_16_ = ZEXT116(0) * local_5c0._0_16_ + ZEXT116(1) * local_5e0._0_16_;
  auVar11._16_16_ = ZEXT116(0) * local_5e0._16_16_ + ZEXT116(1) * local_5c0._0_16_;
  local_520 = vpaddsw_avx2(local_580,auVar11);
  local_580 = vpsubsw_avx2(local_580,auVar11);
  local_5c0._16_16_ = local_500._0_16_;
  local_5c0._0_16_ = local_600._0_16_;
  local_5e0._16_16_ = local_620._0_16_;
  local_5e0._0_16_ = local_4e0._0_16_;
  local_420 = (__m256i)vperm2f128_avx(local_600,local_500,0x31);
  local_280 = (__m256i)vperm2f128_avx((undefined1  [32])local_620,local_4e0,0x31);
  btf_16_avx2(local_628,local_630,&local_420,&local_280,&local_490,&local_590,(__m128i *)&local_4a0,
              (__m128i *)&local_4b0,(__m256i *)&local_480,&local_631);
  local_620[2] = local_4a0;
  local_620[0] = local_490[0];
  local_620[1] = local_490[1];
  local_620[3] = lStack_498;
  local_600._8_8_ = lStack_4a8;
  local_600._0_8_ = local_4b0;
  local_600._16_8_ = local_590[0];
  local_600._24_8_ = local_590[1];
  local_420 = (__m256i)vperm2f128_avx(local_520,local_580,0x31);
  local_280[2] = SUB168(local_580._0_16_,0);
  local_280[3] = SUB168(local_580._0_16_,8);
  local_280[0] = SUB168(local_520._0_16_,0);
  local_280[1] = SUB168(local_520._0_16_,8);
  btf_16_avx2((__m256i *)local_540._0_8_,(__m256i *)local_560._0_8_,&local_420,&local_280,output + 2
              ,output + 0xe,output + 10,output + 6,(__m256i *)&local_480,&local_631);
  local_560 = vpaddsw_avx2(local_5c0,(undefined1  [32])local_620);
  local_620 = (__m256i)vpsubsw_avx2(local_5c0,(undefined1  [32])local_620);
  local_540 = vpaddsw_avx2(local_5e0,local_600);
  local_5c0 = vpsubsw_avx2(local_5e0,local_600);
  local_420._0_16_ = ZEXT116(0) * local_620._0_16_ + ZEXT116(1) * local_560._0_16_;
  local_420._16_16_ = ZEXT116(0) * local_560._16_16_ + ZEXT116(1) * local_620._0_16_;
  local_280 = (__m256i)vperm2i128_avx2(local_540,local_5c0,0x31);
  btf_16_avx2((__m256i *)&local_300,(__m256i *)&local_2e0,&local_420,&local_280,output + 1,
              output + 0xf,output + 9,output + 7,(__m256i *)&local_480,&local_631);
  local_420 = (__m256i)vperm2f128_avx((undefined1  [32])local_620,local_560,0x31);
  local_280._0_16_ = local_5c0._0_16_;
  local_280[2] = local_540._0_8_;
  local_280[3] = local_540._8_8_;
  btf_16_avx2((__m256i *)&local_2c0,(__m256i *)&local_2a0,&local_420,&local_280,output + 5,
              output + 0xb,output + 0xd,output + 3,(__m256i *)&local_480,&local_631);
  return;
}

Assistant:

static inline void fdct8x16_new_avx2(const __m128i *input, __m128i *output,
                                     int8_t cos_bit) {
  const int32_t *cospi = cospi_arr(cos_bit);
  const __m256i __rounding_256 = _mm256_set1_epi32(1 << (cos_bit - 1));
  const __m128i __rounding = _mm_set1_epi32(1 << (cos_bit - 1));
  __m128i temp0, temp1, temp2, temp3;
  __m256i in0, in1;
  __m128i cospi_m32_p32 = pair_set_epi16(-cospi[32], cospi[32]);
  __m128i cospi_p32_p32 = pair_set_epi16(cospi[32], cospi[32]);
  __m128i cospi_p32_m32 = pair_set_epi16(cospi[32], -cospi[32]);
  __m128i cospi_p48_p16 = pair_set_epi16(cospi[48], cospi[16]);
  __m128i cospi_m16_p48 = pair_set_epi16(-cospi[16], cospi[48]);
  __m128i cospi_m48_m16 = pair_set_epi16(-cospi[48], -cospi[16]);
  __m128i cospi_p56_p08 = pair_set_epi16(cospi[56], cospi[8]);
  __m128i cospi_m08_p56 = pair_set_epi16(-cospi[8], cospi[56]);
  __m128i cospi_p24_p40 = pair_set_epi16(cospi[24], cospi[40]);
  __m128i cospi_m40_p24 = pair_set_epi16(-cospi[40], cospi[24]);
  __m128i cospi_p60_p04 = pair_set_epi16(cospi[60], cospi[4]);
  __m128i cospi_m04_p60 = pair_set_epi16(-cospi[4], cospi[60]);
  __m128i cospi_p28_p36 = pair_set_epi16(cospi[28], cospi[36]);
  __m128i cospi_m36_p28 = pair_set_epi16(-cospi[36], cospi[28]);
  __m128i cospi_p44_p20 = pair_set_epi16(cospi[44], cospi[20]);
  __m128i cospi_m20_p44 = pair_set_epi16(-cospi[20], cospi[44]);
  __m128i cospi_p12_p52 = pair_set_epi16(cospi[12], cospi[52]);
  __m128i cospi_m52_p12 = pair_set_epi16(-cospi[52], cospi[12]);

  __m256i cospi_arr[12];

  cospi_arr[0] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m32_p32),
                                         cospi_m32_p32, 0x1);
  cospi_arr[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p32_p32, 0x1);
  cospi_arr[2] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_p32),
                                         cospi_p48_p16, 0x1);
  cospi_arr[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p32_m32),
                                         cospi_m16_p48, 0x1);
  cospi_arr[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m16_p48),
                                         cospi_m48_m16, 0x1);
  cospi_arr[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p48_p16),
                                         cospi_m16_p48, 0x1);
  cospi_arr[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p56_p08),
                                         cospi_p24_p40, 0x1);
  cospi_arr[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m08_p56),
                                         cospi_m40_p24, 0x1);
  cospi_arr[8] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p60_p04),
                                         cospi_p28_p36, 0x1);
  cospi_arr[9] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m04_p60),
                                         cospi_m36_p28, 0x1);
  cospi_arr[10] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_p44_p20),
                                          cospi_p12_p52, 0x1);
  cospi_arr[11] = _mm256_insertf128_si256(_mm256_castsi128_si256(cospi_m20_p44),
                                          cospi_m52_p12, 0x1);

  __m256i x[8];
  x[0] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[0]), input[1], 0x1);
  x[1] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[15]), input[14],
                                 0x1);
  x[2] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[2]), input[3], 0x1);
  x[3] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[13]), input[12],
                                 0x1);
  x[4] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[5]), input[4], 0x1);
  x[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(input[10]), input[11],
                                 0x1);
  x[6] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[7]), input[6], 0x1);
  x[7] =
      _mm256_insertf128_si256(_mm256_castsi128_si256(input[8]), input[9], 0x1);

  // stage 1
  __m256i x1[8];
  x1[0] = _mm256_adds_epi16(x[0], x[1]);
  x1[7] = _mm256_subs_epi16(x[0], x[1]);
  x1[1] = _mm256_adds_epi16(x[2], x[3]);
  x1[6] = _mm256_subs_epi16(x[2], x[3]);
  x1[2] = _mm256_adds_epi16(x[4], x[5]);
  x1[5] = _mm256_subs_epi16(x[4], x[5]);
  x1[3] = _mm256_adds_epi16(x[6], x[7]);
  x1[4] = _mm256_subs_epi16(x[6], x[7]);

  // stage 2
  __m256i x2[8];
  x2[0] = _mm256_adds_epi16(x1[0], x1[3]);
  x2[7] = _mm256_subs_epi16(x1[0], x1[3]);
  x2[1] = _mm256_adds_epi16(x1[1], x1[2]);
  x2[6] = _mm256_subs_epi16(x1[1], x1[2]);
  x2[2] = x1[4];
  x2[3] = x1[7];
  btf_16_avx2(&cospi_arr[0], &cospi_arr[1], &x1[5], &x1[6], &temp0, &temp1,
              &temp2, &temp3, &__rounding_256, &cos_bit);
  x2[4] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp2), temp0, 0x1);
  x2[5] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 3
  __m256i x3[8];
  x2[1] = _mm256_permute4x64_epi64(x2[1], 0x4e);
  x3[0] = _mm256_adds_epi16(x2[0], x2[1]);
  x3[1] = _mm256_subs_epi16(x2[0], x2[1]);
  x3[2] = _mm256_blend_epi32(x2[7], x2[6], 0xf0);
  btf_16_sse2(cospi_m32_p32, cospi_p32_p32, _mm256_castsi256_si128(x2[6]),
              _mm256_extractf128_si256(x2[7], 0x01), temp0, temp1);
  x3[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp1), temp0, 0x1);
  x3[3] = _mm256_adds_epi16(x2[2], x2[4]);
  x3[4] = _mm256_subs_epi16(x2[2], x2[4]);
  x3[5] = _mm256_adds_epi16(x2[3], x2[5]);
  x3[6] = _mm256_subs_epi16(x2[3], x2[5]);

  // stage 4
  __m256i x4[8];
  x4[0] = _mm256_blend_epi32(x3[0], x3[1], 0xf0);
  x4[1] = _mm256_permute2f128_si256(x3[0], x3[1], 0x21);
  btf_16_avx2(&cospi_arr[2], &cospi_arr[3], &x4[0], &x4[1], &output[0],
              &output[8], &output[4], &output[12], &__rounding_256, &cos_bit);
  x4[2] = _mm256_adds_epi16(x3[2], x3[7]);
  x4[3] = _mm256_subs_epi16(x3[2], x3[7]);
  x4[4] = _mm256_permute2f128_si256(x3[3], x3[4], 0x20);
  x4[5] = _mm256_permute2f128_si256(x3[6], x3[5], 0x20);
  in0 = _mm256_permute2f128_si256(x3[3], x3[4], 0x31);
  in1 = _mm256_permute2f128_si256(x3[5], x3[6], 0x31);
  btf_16_avx2(&cospi_arr[4], &cospi_arr[5], &in0, &in1, &temp0, &temp1, &temp2,
              &temp3, &__rounding_256, &cos_bit);

  x4[6] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp0), temp2, 0x1);
  x4[7] = _mm256_insertf128_si256(_mm256_castsi128_si256(temp3), temp1, 0x1);

  // stage 5
  __m256i x5[4];
  in0 = _mm256_permute2f128_si256(x4[2], x4[3], 0x31);
  in1 = _mm256_permute2f128_si256(x4[2], x4[3], 0x20);
  btf_16_avx2(&cospi_arr[6], &cospi_arr[7], &in0, &in1, &output[2], &output[14],
              &output[10], &output[6], &__rounding_256, &cos_bit);
  x5[0] = _mm256_adds_epi16(x4[4], x4[6]);
  x5[1] = _mm256_subs_epi16(x4[4], x4[6]);
  x5[2] = _mm256_adds_epi16(x4[5], x4[7]);
  x5[3] = _mm256_subs_epi16(x4[5], x4[7]);

  // stage 6
  in0 = _mm256_permute2f128_si256(x5[0], x5[1], 0x20);
  in1 = _mm256_permute2f128_si256(x5[2], x5[3], 0x31);
  btf_16_avx2(&cospi_arr[8], &cospi_arr[9], &in0, &in1, &output[1], &output[15],
              &output[9], &output[7], &__rounding_256, &cos_bit);
  in0 = _mm256_permute2f128_si256(x5[1], x5[0], 0x31);
  in1 = _mm256_permute2f128_si256(x5[3], x5[2], 0x20);
  btf_16_avx2(&cospi_arr[10], &cospi_arr[11], &in0, &in1, &output[5],
              &output[11], &output[13], &output[3], &__rounding_256, &cos_bit);
}